

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

LinearSpace3fa * __thiscall
embree::avx512::LineSegmentsISA::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,LineSegmentsISA *this,size_t primID)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vfloat4 a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 local_28 [16];
  
  (*(this->super_LineSegments).super_Geometry.super_RefCount._vptr_RefCount[0x37])(local_28);
  auVar1 = vdpps_avx(local_28,local_28,0x7f);
  auVar4 = ZEXT812(0) << 0x20;
  auVar9 = ZEXT816(0) << 0x40;
  auVar8._4_12_ = auVar4;
  auVar8._0_4_ = auVar1._0_4_;
  auVar6 = vrsqrt14ss_avx512f(auVar9,auVar8);
  fVar14 = auVar6._0_4_;
  fVar14 = fVar14 * 1.5 + auVar1._0_4_ * -0.5 * fVar14 * fVar14 * fVar14;
  aVar10._0_4_ = local_28._0_4_ * fVar14;
  aVar10._4_4_ = local_28._4_4_ * fVar14;
  aVar10._8_4_ = local_28._8_4_ * fVar14;
  aVar10._12_4_ = local_28._12_4_ * fVar14;
  auVar1._8_4_ = 0xff7fffff;
  auVar1._0_8_ = 0xff7fffffff7fffff;
  auVar1._12_4_ = 0xff7fffff;
  uVar2 = vcmpps_avx512vl((undefined1  [16])aVar10,auVar1,5);
  auVar6._8_4_ = 0x7f7fffff;
  auVar6._0_8_ = 0x7f7fffff7f7fffff;
  auVar6._12_4_ = 0x7f7fffff;
  uVar3 = vcmpps_avx512vl((undefined1  [16])aVar10,auVar6,2);
  if ((~((ushort)uVar2 & (ushort)uVar3) & 7) == 0) {
    auVar6 = vshufpd_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,1);
    auVar1 = vmovshdup_avx((undefined1  [16])aVar10);
    auVar18._8_4_ = 0x80000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar18._12_4_ = 0x80000000;
    auVar17._0_4_ = auVar1._0_4_ ^ 0x80000000;
    auVar1 = vunpckhps_avx((undefined1  [16])aVar10,auVar9);
    auVar17._4_12_ = auVar4;
    auVar17 = vshufps_avx(auVar1,auVar17,0x41);
    auVar1 = vdpps_avx(auVar17,auVar17,0x7f);
    auVar15._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
    auVar15._8_8_ = auVar6._8_8_ ^ auVar18._8_8_;
    auVar8 = vinsertps_avx(auVar15,(undefined1  [16])aVar10,0x2a);
    auVar6 = vdpps_avx(auVar8,auVar8,0x7f);
    uVar2 = vcmpps_avx512vl(auVar6,auVar1,1);
    auVar1 = vpmovm2d_avx512vl(uVar2);
    auVar19._0_4_ = auVar1._0_4_;
    auVar19._4_4_ = auVar19._0_4_;
    auVar19._8_4_ = auVar19._0_4_;
    auVar19._12_4_ = auVar19._0_4_;
    uVar5 = vpmovd2m_avx512vl(auVar19);
    auVar1 = vpcmpeqd_avx(auVar19,auVar19);
    auVar7._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar1._4_4_;
    auVar7._0_4_ = (uint)((byte)uVar5 & 1) * auVar1._0_4_;
    auVar7._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar1._8_4_;
    auVar7._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar1._12_4_;
    auVar1 = vblendvps_avx(auVar8,auVar17,auVar7);
    auVar6 = vdpps_avx(auVar1,auVar1,0x7f);
    auVar20._4_12_ = auVar4;
    auVar20._0_4_ = auVar6._0_4_;
    auVar8 = vrsqrt14ss_avx512f(auVar9,auVar20);
    fVar14 = auVar8._0_4_;
    fVar14 = fVar14 * 1.5 - auVar6._0_4_ * 0.5 * fVar14 * fVar14 * fVar14;
    aVar16._0_4_ = auVar1._0_4_ * fVar14;
    aVar16._4_4_ = auVar1._4_4_ * fVar14;
    aVar16._8_4_ = auVar1._8_4_ * fVar14;
    aVar16._12_4_ = auVar1._12_4_ * fVar14;
    auVar1 = vshufps_avx((undefined1  [16])aVar16,(undefined1  [16])aVar16,0xc9);
    auVar6 = vshufps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0xc9);
    auVar21._0_4_ = aVar16._0_4_ * auVar6._0_4_;
    auVar21._4_4_ = aVar16._4_4_ * auVar6._4_4_;
    auVar21._8_4_ = aVar16._8_4_ * auVar6._8_4_;
    auVar21._12_4_ = aVar16._12_4_ * auVar6._12_4_;
    auVar1 = vfmsub231ps_fma(auVar21,(undefined1  [16])aVar10,auVar1);
    auVar6 = vshufps_avx(auVar1,auVar1,0xc9);
    auVar1 = vdpps_avx(auVar6,auVar6,0x7f);
    auVar22._4_12_ = auVar4;
    auVar22._0_4_ = auVar1._0_4_;
    auVar9 = vrsqrt14ss_avx512f(auVar9,auVar22);
    fVar14 = auVar9._0_4_;
    fVar14 = fVar14 * 1.5 - auVar1._0_4_ * 0.5 * fVar14 * fVar14 * fVar14;
    fVar11 = fVar14 * auVar6._0_4_;
    fVar12 = fVar14 * auVar6._4_4_;
    fVar13 = fVar14 * auVar6._8_4_;
    fVar14 = fVar14 * auVar6._12_4_;
  }
  else {
    fVar11 = 0.0;
    fVar12 = 1.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    aVar16 = SUB6416(ZEXT464(0x3f800000),0);
    aVar10 = _DAT_01f46750;
  }
  (__return_storage_ptr__->vx).field_0 = aVar16;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar11;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar12;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar13;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar14;
  (__return_storage_ptr__->vz).field_0 = aVar10;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpace(const size_t primID) const
      {
        const Vec3fa dir = normalize(computeDirection(primID));
        if (is_finite(dir)) return frame(dir);
        else return LinearSpace3fa(one);
      }